

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_22::Struct2Local::adjustTypeFlowingThrough(Struct2Local *this,Expression *curr)

{
  ParentChildInteraction PVar1;
  bool bVar2;
  HeapType heapType;
  Type local_20;
  Expression *local_18;
  Expression *curr_local;
  Struct2Local *this_local;
  
  local_18 = curr;
  curr_local = (Expression *)this;
  PVar1 = EscapeAnalyzer::getInteraction(this->analyzer,curr);
  if (PVar1 == Flows) {
    bVar2 = wasm::Type::isRef(&local_18->type);
    if (!bVar2) {
      __assert_fail("curr->type.isRef()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Heap2Local.cpp"
                    ,0x27d,
                    "void wasm::(anonymous namespace)::Struct2Local::adjustTypeFlowingThrough(Expression *)"
                   );
    }
    heapType = wasm::Type::getHeapType(&local_18->type);
    wasm::Type::Type(&local_20,heapType,Nullable,Inexact);
    (local_18->type).id = local_20.id;
  }
  return;
}

Assistant:

void adjustTypeFlowingThrough(Expression* curr) {
    if (analyzer.getInteraction(curr) != ParentChildInteraction::Flows) {
      return;
    }

    // Our allocation passes through this expr. We must turn its type into a
    // nullable one, because we will remove things like RefAsNonNull of it,
    // which means we may no longer have a non-nullable value as our input,
    // and we could fail to validate. It is safe to make this change in terms
    // of our parent, since we know very specifically that only safe things
    // will end up using our value, like a StructGet or a Drop, which do not
    // care about non-nullability.
    assert(curr->type.isRef());
    curr->type = Type(curr->type.getHeapType(), Nullable);
  }